

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O1

int mbedtls_rsa_pkcs1_verify
              (mbedtls_rsa_context *ctx,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig
              )

{
  size_t __size;
  int iVar1;
  int iVar2;
  uchar *output;
  uchar *dst;
  
  iVar1 = -0x4080;
  if ((hashlen == 0 && md_alg == MBEDTLS_MD_NONE || hash != (uchar *)0x0) &&
     (iVar1 = -0x4100, ctx->padding == 0)) {
    iVar1 = -0x4080;
    if (hashlen == 0 && md_alg == MBEDTLS_MD_NONE || hash != (uchar *)0x0) {
      __size = ctx->len;
      output = (uchar *)calloc(1,__size);
      iVar1 = -0x10;
      if (output == (uchar *)0x0) {
        dst = (uchar *)0x0;
      }
      else {
        dst = (uchar *)calloc(1,__size);
        if (dst == (uchar *)0x0) {
          dst = (uchar *)0x0;
        }
        else {
          iVar1 = rsa_rsassa_pkcs1_v15_encode(md_alg,hashlen,hash,__size,dst);
          if ((iVar1 == 0) && (iVar1 = mbedtls_rsa_public(ctx,sig,output), iVar1 == 0)) {
            iVar2 = mbedtls_ct_memcmp(output,dst,__size);
            iVar1 = -0x4380;
            if (iVar2 == 0) {
              iVar1 = 0;
            }
          }
        }
      }
      if (output != (uchar *)0x0) {
        mbedtls_zeroize_and_free(output,__size);
      }
      if (dst != (uchar *)0x0) {
        mbedtls_zeroize_and_free(dst,__size);
      }
    }
    return iVar1;
  }
  return iVar1;
}

Assistant:

int mbedtls_rsa_pkcs1_verify(mbedtls_rsa_context *ctx,
                             mbedtls_md_type_t md_alg,
                             unsigned int hashlen,
                             const unsigned char *hash,
                             const unsigned char *sig)
{
    if ((md_alg != MBEDTLS_MD_NONE || hashlen != 0) && hash == NULL) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    switch (ctx->padding) {
#if defined(MBEDTLS_PKCS1_V15)
        case MBEDTLS_RSA_PKCS_V15:
            return mbedtls_rsa_rsassa_pkcs1_v15_verify(ctx, md_alg,
                                                       hashlen, hash, sig);
#endif

#if defined(MBEDTLS_PKCS1_V21)
        case MBEDTLS_RSA_PKCS_V21:
            return mbedtls_rsa_rsassa_pss_verify(ctx, md_alg,
                                                 hashlen, hash, sig);
#endif

        default:
            return MBEDTLS_ERR_RSA_INVALID_PADDING;
    }
}